

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

int __thiscall
QtPrivate::QGenericArrayOps<QMimeMagicRule>::truncate
          (QGenericArrayOps<QMimeMagicRule> *this,char *__file,__off_t __length)

{
  Data *pDVar1;
  char *extraout_RAX;
  char *pcVar2;
  long lVar3;
  QMimeMagicRule *this_00;
  
  pcVar2 = (char *)(this->super_QArrayDataPointer<QMimeMagicRule>).size;
  if (pcVar2 != __file) {
    this_00 = (this->super_QArrayDataPointer<QMimeMagicRule>).ptr + (long)__file;
    lVar3 = (long)pcVar2 * 0x88 + (long)__file * -0x88;
    do {
      pDVar1 = (this_00->m_pattern).d.d;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((this_00->m_pattern).d.d)->super_QArrayData,1,0x10);
        }
      }
      pDVar1 = (this_00->m_mask).d.d;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((this_00->m_mask).d.d)->super_QArrayData,1,0x10);
        }
      }
      pDVar1 = (this_00->m_value).d.d;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((this_00->m_value).d.d)->super_QArrayData,1,0x10);
        }
      }
      QArrayDataPointer<QMimeMagicRule>::~QArrayDataPointer
                ((QArrayDataPointer<QMimeMagicRule> *)this_00);
      this_00 = this_00 + 1;
      lVar3 = lVar3 + -0x88;
      pcVar2 = extraout_RAX;
    } while (lVar3 != 0);
  }
  (this->super_QArrayDataPointer<QMimeMagicRule>).size = (qsizetype)__file;
  return (int)pcVar2;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }